

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O2

void __thiscall qpdf::pl::Count::Count(Count *this,unsigned_long id,Pipeline *next)

{
  Pipeline::Pipeline(&this->super_Pipeline,"",next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Count_002b3288;
  this->count = 0;
  this->str = (string *)0x0;
  (this->link)._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t
  .super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
  super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = (Link *)0x0;
  this->id_ = id;
  this->pass_immediately_to_next = next != (Pipeline *)0x0;
  return;
}

Assistant:

Count(unsigned long id, Pipeline* next = nullptr) :
            Pipeline("", next),
            id_(id),
            pass_immediately_to_next(next)
        {
        }